

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftUBbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_130;
  cpp_dec_float<200U,_int,_void> local_128;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x1c;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems[0xe] = 0;
  local_a8.data._M_elems[0xf] = 0;
  local_a8.data._M_elems[0x10] = 0;
  local_a8.data._M_elems[0x11] = 0;
  local_a8.data._M_elems[0x12] = 0;
  local_a8.data._M_elems[0x13] = 0;
  local_a8.data._M_elems[0x14] = 0;
  local_a8.data._M_elems[0x15] = 0;
  local_a8.data._M_elems[0x16] = 0;
  local_a8.data._M_elems[0x17] = 0;
  local_a8.data._M_elems[0x18] = 0;
  local_a8.data._M_elems[0x19] = 0;
  local_a8.data._M_elems._104_5_ = 0;
  local_a8.data._M_elems[0x1b]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_a8,&to->m_backend,
             &(this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  local_130 = 0.0;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a8,&local_130);
  if (tVar1) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x1c;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems[0xe] = 0;
    local_128.data._M_elems[0xf] = 0;
    local_128.data._M_elems[0x10] = 0;
    local_128.data._M_elems[0x11] = 0;
    local_128.data._M_elems[0x12] = 0;
    local_128.data._M_elems[0x13] = 0;
    local_128.data._M_elems[0x14] = 0;
    local_128.data._M_elems[0x15] = 0;
    local_128.data._M_elems[0x16] = 0;
    local_128.data._M_elems[0x17] = 0;
    local_128.data._M_elems[0x18] = 0;
    local_128.data._M_elems[0x19] = 0;
    local_128.data._M_elems._104_5_ = 0;
    local_128.data._M_elems[0x1b]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_128,&to->m_backend,
               &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_128,0.0,(type *)0x0);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_128);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&to->m_backend);
  return;
}

Assistant:

void shiftUBbound(int i, R to)
   {
      assert(theType == ENTER);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX(to - theUBbound[i], 0.0);
      theUBbound[i] = to;
   }